

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bit_reader_utils.c
# Opt level: O1

uint32_t VP8GetValue(VP8BitReader *br,int bits)

{
  ulong *puVar1;
  ulong uVar2;
  uint uVar3;
  byte bVar4;
  uint uVar5;
  int iVar6;
  uint32_t uVar7;
  uint uVar8;
  uint uVar9;
  
  if (bits < 1) {
    uVar7 = 0;
  }
  else {
    iVar6 = bits + 1;
    uVar7 = 0;
    do {
      uVar9 = br->range_;
      if (br->bits_ < 0) {
        puVar1 = (ulong *)br->buf_;
        if (puVar1 < br->buf_max_) {
          uVar2 = *puVar1;
          br->buf_ = (uint8_t *)((long)puVar1 + 7);
          br->value_ = br->value_ << 0x38 |
                       ((uVar2 & 0xff000000000000) >> 0x28 | (uVar2 & 0xff0000000000) >> 0x18 |
                        (uVar2 & 0xff00000000) >> 8 | (uVar2 & 0xff000000) << 8 |
                        (uVar2 & 0xff0000) << 0x18 | (uVar2 & 0xff00) << 0x28 | uVar2 << 0x38) >> 8;
          br->bits_ = br->bits_ + 0x38;
        }
        else {
          VP8LoadFinalBytes(br);
        }
      }
      uVar5 = uVar9 >> 1 & 0xffffff;
      bVar4 = (byte)br->bits_;
      uVar8 = (uint)(br->value_ >> (bVar4 & 0x3f));
      if (uVar5 < uVar8) {
        uVar9 = uVar9 - uVar5;
        br->value_ = br->value_ - ((ulong)uVar5 + 1 << (bVar4 & 0x3f));
      }
      else {
        uVar9 = uVar5 + 1;
      }
      uVar3 = 0x1f;
      if (uVar9 != 0) {
        for (; uVar9 >> uVar3 == 0; uVar3 = uVar3 - 1) {
        }
      }
      br->bits_ = br->bits_ - (uVar3 ^ 7);
      br->range_ = (uVar9 << ((byte)(uVar3 ^ 7) & 0x1f)) - 1;
      uVar7 = uVar7 | (uint)(uVar5 < uVar8) << ((char)iVar6 - 2U & 0x1f);
      iVar6 = iVar6 + -1;
    } while (1 < iVar6);
  }
  return uVar7;
}

Assistant:

uint32_t VP8GetValue(VP8BitReader* const br, int bits, const char label[]) {
  uint32_t v = 0;
  while (bits-- > 0) {
    v |= VP8GetBit(br, 0x80, label) << bits;
  }
  return v;
}